

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimam.cpp
# Opt level: O2

bool data_is_subset(BtorSimArrayModel *self,BtorSimArrayModel *other)

{
  _Bool _Var1;
  int iVar2;
  const_iterator cVar3;
  mapped_type *ppBVar4;
  BtorSimBitVector *bv;
  uint64_t uVar5;
  BtorSimBitVector *b;
  __node_base *p_Var6;
  value_type i;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>
  local_58;
  
  p_Var6 = &(self->data)._M_h._M_before_begin;
  do {
    p_Var6 = p_Var6->_M_nxt;
    if (p_Var6 == (__node_base *)0x0) {
LAB_0010cd54:
      return p_Var6 == (__node_base *)0x0;
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>
    ::pair(&local_58,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>
            *)(p_Var6 + 1));
    cVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(other->data)._M_h,&local_58.first);
    if (cVar3.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_true>
        ._M_cur == (__node_type *)0x0) {
      if (other->const_init != (BtorSimBitVector *)0x0) {
        iVar2 = btorsim_bv_compare(local_58.second,other->const_init);
        goto joined_r0x0010cd34;
      }
      if (other->random_seed != 0) {
        bv = btorsim_bv_char_to_bv(local_58.first._M_dataplus._M_p);
        uVar5 = btorsim_bv_to_uint64(bv);
        b = btorsim_bv_uint64_to_bv
                      (((other->random_seed + uVar5) * (other->random_seed + uVar5 + 1) >> 1) +
                       uVar5,(uint32_t)other->element_width);
        iVar2 = btorsim_bv_compare(local_58.second,b);
        btorsim_bv_free(bv);
        btorsim_bv_free(b);
        goto joined_r0x0010cd34;
      }
      _Var1 = btorsim_bv_is_zero(local_58.second);
      if (!_Var1) goto LAB_0010cd4a;
    }
    else {
      ppBVar4 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      *)&other->data,&local_58.first);
      iVar2 = btorsim_bv_compare(*ppBVar4,local_58.second);
joined_r0x0010cd34:
      if (iVar2 != 0) {
LAB_0010cd4a:
        std::__cxx11::string::~string((string *)&local_58);
        goto LAB_0010cd54;
      }
    }
    std::__cxx11::string::~string((string *)&local_58);
  } while( true );
}

Assistant:

bool
data_is_subset (const BtorSimArrayModel& self, const BtorSimArrayModel& other)
{
  for (auto i : self.data)
  // check all accessed elements in self have same value in other
  {
    if (other.data.find (i.first) == other.data.end ())
    // data is not in other, but may be same as initial value if an extra read
    // was called on self
    {
      if (other.const_init)  // init value is from init statement
      {
        if (btorsim_bv_compare (i.second, other.const_init)) return false;
      }
      else if (other.random_seed)  // init value is from randomize
      {
        BtorSimBitVector* idx     = btorsim_bv_char_to_bv (i.first.c_str ());
        BtorSimBitVector* initval = btorsim_bv_uint64_to_bv (
            other.get_random_init (btorsim_bv_to_uint64 (idx)),
            other.element_width);
        int is_different_from_random_init =
            btorsim_bv_compare (i.second, initval);
        btorsim_bv_free (idx);
        btorsim_bv_free (initval);
        if (is_different_from_random_init) return false;
      }
      else  // init value is zero
      {
        if (!btorsim_bv_is_zero (i.second)) return false;
      }
    }
    else if (btorsim_bv_compare (other.data.at (i.first), i.second) != 0)
      return false;
  }
  return true;
}